

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O0

void __thiscall
Diligent::FramebufferCache::OnDestroyRenderPass(FramebufferCache *this,VkRenderPass Pass)

{
  RenderDeviceVkImpl *this_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>,_std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>_>
  pVar4;
  const_iterator local_98;
  const_iterator local_90;
  uint local_84;
  undefined1 auStack_80 [4];
  Uint32 rt;
  anon_class_16_2_3fd5c1ec PurgeViewToKeyMap;
  _Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
  local_58;
  iterator fb_it;
  FramebufferCacheKey *Key;
  _Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
  it;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
  local_30;
  pair<std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>,_std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>_>
  equal_range;
  lock_guard<std::mutex> Lock;
  VkRenderPass Pass_local;
  FramebufferCache *this_local;
  
  Lock._M_device = (mutex_type *)Pass;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&equal_range.second,&this->m_Mutex);
  pVar4 = std::
          unordered_multimap<VkRenderPass_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
          ::equal_range(&this->m_RenderPassToKeyMap,(key_type *)&Lock);
  local_30._M_cur =
       (__node_type *)
       pVar4.first.
       super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
       ._M_cur;
  while( true ) {
    equal_range.first =
         pVar4.second.
         super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
         ._M_cur;
    Key = (FramebufferCacheKey *)
          pVar4.first.
          super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
          ._M_cur;
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                        *)&Key,(_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                                *)&equal_range);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
             ::operator->((_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
                           *)&Key);
    fb_it.
    super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
               )&ppVar2->second;
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
         ::find(&this->m_Cache,
                (key_type *)
                fb_it.
                super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                ._M_cur);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
         ::end(&this->m_Cache);
    bVar1 = std::__detail::operator!=(&local_58,&local_60);
    if (bVar1) {
      this_00 = this->m_DeviceVk;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_false,_true>
                             *)&local_58);
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
               ::operator->((_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
                             *)&Key);
      RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
      ::
      SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,void>
                ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                  *)this_00,&ppVar3->second,(ppVar2->second).CommandQueueMask);
      PurgeViewToKeyMap.Pass =
           (VkRenderPass)
           std::
           unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
           ::erase(&this->m_Cache,(iterator)local_58._M_cur);
    }
    PurgeViewToKeyMap.this = (FramebufferCache *)Lock._M_device;
    _auStack_80 = this;
    for (local_84 = 0;
        local_84 <
        *(uint *)((long)fb_it.
                        super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                        ._M_cur + 8); local_84 = local_84 + 1) {
      OnDestroyRenderPass::anon_class_16_2_3fd5c1ec::operator()
                ((anon_class_16_2_3fd5c1ec *)auStack_80,
                 *(VkImageView *)
                  ((long)fb_it.
                         super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                         ._M_cur + 0x18 + (ulong)local_84 * 8));
    }
    OnDestroyRenderPass::anon_class_16_2_3fd5c1ec::operator()
              ((anon_class_16_2_3fd5c1ec *)auStack_80,
               *(VkImageView *)
                ((long)fb_it.
                       super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                       ._M_cur + 0x10));
    OnDestroyRenderPass::anon_class_16_2_3fd5c1ec::operator()
              ((anon_class_16_2_3fd5c1ec *)auStack_80,
               *(VkImageView *)
                ((long)fb_it.
                       super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                       ._M_cur + 0x58));
    std::__detail::
    _Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
    ::operator++((_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
                  *)&Key);
    pVar4.second = (_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
                    )(_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
                      )equal_range.first.
                       super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                       ._M_cur;
    pVar4.first.
    super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
               )(_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                 )Key;
  }
  std::__detail::
  _Node_const_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
  ::_Node_const_iterator
            (&local_90,
             (_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
              *)&local_30);
  std::__detail::
  _Node_const_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
  ::_Node_const_iterator(&local_98,&equal_range.first);
  std::
  unordered_multimap<VkRenderPass_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
  ::erase(&this->m_RenderPassToKeyMap,local_90,local_98);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&equal_range.second);
  return;
}

Assistant:

void FramebufferCache::OnDestroyRenderPass(VkRenderPass Pass)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};

    auto equal_range = m_RenderPassToKeyMap.equal_range(Pass);
    for (auto it = equal_range.first; it != equal_range.second; ++it)
    {
        const FramebufferCacheKey& Key = it->second;

        auto fb_it = m_Cache.find(Key);
        // Multiple image views may be associated with the same key.
        // The framebuffer is deleted whenever any of the image views or render pass is destroyed
        if (fb_it != m_Cache.end())
        {
            m_DeviceVk.SafeReleaseDeviceObject(std::move(fb_it->second), it->second.CommandQueueMask);
            m_Cache.erase(fb_it);
        }

        // Remove all keys from m_ViewToKeyMap that use the render pass
        auto PurgeViewToKeyMap = [this, Pass](VkImageView vkView) {
            if (vkView == VK_NULL_HANDLE)
                return;
            auto view_it_range = m_ViewToKeyMap.equal_range(vkView);
            for (auto view_it = view_it_range.first; view_it != view_it_range.second;)
            {
                if (view_it->second.Pass == Pass)
                    view_it = m_ViewToKeyMap.erase(view_it);
                else
                    ++view_it;
            }
        };
        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
        {
            PurgeViewToKeyMap(Key.RTVs[rt]);
        }
        PurgeViewToKeyMap(Key.DSV);
        PurgeViewToKeyMap(Key.ShadingRate);
    }
    m_RenderPassToKeyMap.erase(equal_range.first, equal_range.second);
}